

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  TestCaseStats *this_local;
  
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  ~vector(&this->m_testStats);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__cxx11::string::~string((string *)&this->m_className);
  std::__cxx11::string::~string((string *)&this->m_status);
  return;
}

Assistant:

TestCaseStats( const std::string& className, const std::string& name )
            :   m_className( className ),
                m_name( name )
            {}